

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PWM.cpp
# Opt level: O3

void __thiscall GPIO::PWM::Impl::Impl(Impl *this,string *channel,int frequency_hz)

{
  Directions DVar1;
  Directions DVar2;
  MainModule *pMVar3;
  ostream *poVar4;
  mapped_type *pmVar5;
  runtime_error *this_00;
  
  pMVar3 = global();
  MainModule::_channel_to_info(&this->_ch_info,pMVar3,channel,false,true);
  this->_started = false;
  this->_frequency_hz = 0;
  this->_period_ns = 0;
  this->_duty_cycle_percent = 0.0;
  this->_duty_cycle_ns = 0;
  pMVar3 = global();
  DVar1 = MainModule::_app_channel_configuration(pMVar3,&this->_ch_info);
  if (DVar1 != HARD_PWM) {
    if (DVar1 - OUT < 2) {
      cleanup((EVP_PKEY_CTX *)channel);
    }
    pMVar3 = global();
    if (pMVar3->_gpio_warnings == true) {
      pMVar3 = global();
      DVar1 = MainModule::_sysfs_channel_configuration(pMVar3,&this->_ch_info);
      pMVar3 = global();
      DVar2 = MainModule::_app_channel_configuration(pMVar3,&this->_ch_info);
      if ((DVar1 != UNKNOWN) && (DVar2 == UNKNOWN)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "[WARNING] This channel is already in use, continuing anyway. Use setwarnings(false) to disable warnings. "
                   ,0x69);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"channel: ",9);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,(channel->_M_dataplus)._M_p,
                            channel->_M_string_length);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
      }
    }
    pMVar3 = global();
    MainModule::_export_pwm(pMVar3,&this->_ch_info);
    pMVar3 = global();
    MainModule::_set_pwm_duty_cycle(pMVar3,&this->_ch_info,0);
    this->_frequency_hz = -frequency_hz;
    _reconfigure(this,frequency_hz,0.0,false);
    pMVar3 = global();
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GPIO::Directions,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_GPIO::Directions>_>_>
             ::operator[](&pMVar3->_channel_configuration,channel);
    *pmVar5 = HARD_PWM;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t create duplicate PWM objects");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Impl(const std::string& channel, int frequency_hz) : _ch_info(global()._channel_to_info(channel, false, true))
        {
            try
            {
                Directions app_cfg = global()._app_channel_configuration(_ch_info);
                if (app_cfg == HARD_PWM)
                    throw std::runtime_error("Can't create duplicate PWM objects");
                /*
                Apps typically set up channels as GPIO before making them be PWM,
                because RPi.GPIO does soft-PWM. We must undo the GPIO export to
                allow HW PWM to run on the pin.
                */
                if (app_cfg == IN || app_cfg == OUT)
                    cleanup(channel);

                if (global()._gpio_warnings)
                {
                    auto sysfs_cfg = global()._sysfs_channel_configuration(_ch_info);
                    app_cfg = global()._app_channel_configuration(_ch_info);

                    // warn if channel has been setup external to current program
                    if (app_cfg == UNKNOWN && sysfs_cfg != UNKNOWN)
                    {
                        std::cerr << "[WARNING] This channel is already in use, continuing "
                                     "anyway. "
                                     "Use setwarnings(false) to disable warnings. "
                                  << "channel: " << channel << std::endl;
                    }
                }

                global()._export_pwm(_ch_info);
                global()._set_pwm_duty_cycle(_ch_info, 0);
                // Anything that doesn't match new frequency_hz
                _frequency_hz = -1 * frequency_hz;
                _reconfigure(frequency_hz, 0.0);
                global()._channel_configuration[channel] = HARD_PWM;
            }
            catch (std::exception& e)
            {
                throw _error(e, "PWM::PWM()");
            }
        }